

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O2

void __thiscall rcg::Image::Image(Image *this,Buffer *buffer,uint32_t part)

{
  _Head_base<0UL,_unsigned_char_*,_false> __dest;
  bool bVar1;
  uint64_t uVar2;
  size_t sVar3;
  size_t sVar4;
  pointer __p;
  void *__src;
  GenTLException *pGVar5;
  allocator local_49;
  string local_48;
  
  (this->pixel)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  bVar1 = Buffer::getImagePresent(buffer,part);
  if (!bVar1) {
    pGVar5 = (GenTLException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_48,"Image::Image(): Now image available.",&local_49);
    GenTLException::GenTLException(pGVar5,&local_48);
    __cxa_throw(pGVar5,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  uVar2 = Buffer::getTimestampNS(buffer);
  this->timestamp = uVar2;
  sVar3 = Buffer::getWidth(buffer,part);
  this->width = sVar3;
  sVar3 = Buffer::getHeight(buffer,part);
  this->height = sVar3;
  sVar3 = Buffer::getXOffset(buffer,part);
  this->xoffset = sVar3;
  sVar3 = Buffer::getYOffset(buffer,part);
  this->yoffset = sVar3;
  sVar3 = Buffer::getXPadding(buffer,part);
  this->xpadding = sVar3;
  sVar3 = Buffer::getYPadding(buffer);
  this->ypadding = sVar3;
  uVar2 = Buffer::getFrameID(buffer);
  this->frameid = uVar2;
  uVar2 = Buffer::getPixelFormat(buffer,part);
  this->pixelformat = uVar2;
  bVar1 = Buffer::isBigEndian(buffer);
  this->bigendian = bVar1;
  sVar3 = Buffer::getSize(buffer,part);
  sVar4 = Buffer::getSizeFilled(buffer);
  if (sVar4 < sVar3) {
    sVar3 = sVar4;
  }
  sVar4 = Buffer::getSizeFilled(buffer);
  if (sVar4 != 0) {
    __p = (pointer)operator_new__(sVar3);
    std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::reset
              ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)this,__p);
    __dest._M_head_impl =
         (this->pixel)._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    __src = Buffer::getBase(buffer,part);
    memcpy(__dest._M_head_impl,__src,sVar3);
    return;
  }
  pGVar5 = (GenTLException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_48,"Image without data",&local_49);
  GenTLException::GenTLException(pGVar5,&local_48);
  __cxa_throw(pGVar5,&GenTLException::typeinfo,GenTLException::~GenTLException);
}

Assistant:

Image::Image(const Buffer *buffer, uint32_t part)
{
  if (buffer->getImagePresent(part))
  {
    timestamp=buffer->getTimestampNS();

    width=buffer->getWidth(part);
    height=buffer->getHeight(part);
    xoffset=buffer->getXOffset(part);
    yoffset=buffer->getYOffset(part);
    xpadding=buffer->getXPadding(part);
    ypadding=buffer->getYPadding();
    frameid=buffer->getFrameID();
    pixelformat=buffer->getPixelFormat(part);
    bigendian=buffer->isBigEndian();

    const size_t size=std::min(buffer->getSize(part), buffer->getSizeFilled());

    if (buffer->getSizeFilled() == 0)
    {
      throw GenTLException("Image without data");
    }

    pixel.reset(new uint8_t [size]);

    memcpy(pixel.get(), reinterpret_cast<uint8_t *>(buffer->getBase(part)), size);
  }
  else
  {
    throw GenTLException("Image::Image(): Now image available.");
  }
}